

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backend.c
# Opt level: O2

axbStatus_t axbMemBackendSetName(axbMemBackend_s *ops,char *name)

{
  size_t sVar1;
  char *pcVar2;
  long lVar3;
  
  sVar1 = strlen(name);
  if (ops->name_capacity < sVar1) {
    free(ops->name);
    ops->name_capacity = sVar1 + 2;
    pcVar2 = (char *)malloc(sVar1 + 2);
    ops->name = pcVar2;
  }
  for (lVar3 = 0; sVar1 + 1 != lVar3; lVar3 = lVar3 + 1) {
    ops->name[lVar3] = name[lVar3];
  }
  return 0;
}

Assistant:

axbStatus_t axbMemBackendSetName(struct axbMemBackend_s *ops, const char *name)
{
  size_t len = strlen(name);
  if (len > ops->name_capacity) {
    free(ops->name);
    ops->name_capacity = len + 2;
    ops->name = malloc(ops->name_capacity);
  }
  for (size_t i=0; i<=len; ++i) ops->name[i] = name[i];

  return 0;
}